

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_gather_sampler_2d_shadow
               (NegativeTestContext *ctx)

{
  ShaderType SVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  char *__s;
  DataType pDataType;
  undefined8 in_R9;
  DataType thirdArgument;
  undefined1 *in_stack_fffffffffffffdc8;
  string local_190;
  undefined1 local_170 [8];
  string shaderSource_3;
  undefined1 local_130 [8];
  string shaderSource_2;
  undefined1 local_f0 [8];
  string shaderSource_1;
  undefined1 local_b0 [8];
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_48;
  int shaderNdx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"textureGrad - sampler2DShadow",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
    bVar3 = NegativeTestContext::isShaderSupported
                      (local_10,*(ShaderType *)
                                 (NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_48 * 4));
    pNVar2 = local_10;
    thirdArgument = (DataType)in_stack_fffffffffffffdc8;
    pDataType = (DataType)in_R9;
    if (bVar3) {
      __s = glu::getShaderTypeName
                      (*(ShaderType *)
                        (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4))
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,__s,
                 (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
      std::operator+(&local_68,"Verify shader: ",&local_88);
      NegativeTestContext::beginSection(pNVar2,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf))
      ;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)local_b0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_48 * 4),0x2f,TYPE_FLOAT,pDataType);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)
               (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_1.field_2._M_local_buf + 8),(string *)local_b0);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_1.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_b0);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)local_f0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_48 * 4),0x2f,TYPE_FLOAT_VEC2,TYPE_INT,thirdArgument);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)
               (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_2.field_2._M_local_buf + 8),(string *)local_f0);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_2.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_f0);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)local_130,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_48 * 4),0x2f,TYPE_FLOAT,TYPE_FLOAT,thirdArgument);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)
               (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_3.field_2._M_local_buf + 8),(string *)local_130);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_3.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_3.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_130);
      in_stack_fffffffffffffdc8 = NegativeTestShared::(anonymous_namespace)::s_shaders;
      in_R9 = 1;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)local_170,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_48 * 4),0x2c,TYPE_FLOAT_VEC2,TYPE_FLOAT,0x2c264e0);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)(in_stack_fffffffffffffdc8 + (long)local_48 * 4);
      std::__cxx11::string::string((string *)&local_190,(string *)local_170);
      verifyShader(pNVar2,SVar1,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)local_170);
      NegativeTestContext::endSection(local_10);
    }
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void texture_gather_sampler_2d_shadow (NegativeTestContext& ctx)
{
	ctx.beginSection("textureGrad - sampler2DShadow");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC2, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}